

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Privkey * __thiscall
cfd::core::Privkey::operator-=(Privkey *__return_storage_ptr__,Privkey *this,Privkey *right)

{
  Privkey key;
  Privkey PStack_58;
  Privkey local_38;
  
  CreateNegate(&local_38,right);
  CreateTweakAdd(&PStack_58,this,&local_38);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  operator=(this,&PStack_58);
  Privkey(__return_storage_ptr__,this);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&PStack_58);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::operator-=(const Privkey &right) {
  Privkey key = CreateTweakAdd(right.CreateNegate());
  *this = key;
  return *this;
}